

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O0

void __thiscall WSNTopologyBasedEnergy::DrawWSNLayer(WSNTopologyBasedEnergy *this)

{
  _InputArray local_2a0;
  allocator<char> local_281;
  string local_280 [32];
  Scalar_<double> local_260;
  Point_<int> local_240;
  _InputOutputArray local_238;
  _InputArray local_220;
  allocator<char> local_201;
  string local_200 [32];
  Scalar_<double> local_1e0;
  Point_<int> local_1c0;
  _InputOutputArray local_1b8;
  _InputArray local_1a0;
  allocator<char> local_181;
  string local_180 [32];
  Scalar_<double> local_160;
  Point_<int> local_140;
  _InputOutputArray local_138;
  _InputArray local_120;
  allocator<char> local_101;
  string local_100 [32];
  Scalar_<double> local_e0;
  Point_<int> local_c0;
  _InputOutputArray local_b8;
  _InputArray local_a0;
  allocator<char> local_81;
  string local_80 [32];
  Scalar_<double> local_60;
  Point_<int> local_30;
  _InputOutputArray local_28;
  WSNTopologyBasedEnergy *local_10;
  WSNTopologyBasedEnergy *this_local;
  
  local_10 = this;
  cv::_InputOutputArray::_InputOutputArray(&local_28,&this->img);
  cv::Point_<int>::Point_(&local_30,0,0);
  cv::Scalar_<double>::Scalar_(&local_60,255.0,0.0,255.0,0.0);
  cv::circle(&local_28,&local_30,1,&local_60,1,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,"WSN",&local_81);
  cv::_InputArray::_InputArray(&local_a0,&this->img);
  cv::imshow(local_80,&local_a0);
  cv::_InputArray::~_InputArray(&local_a0);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  if ((this->Test & 1U) == 1) {
    cv::waitKey(200);
  }
  cv::_InputOutputArray::_InputOutputArray(&local_b8,&this->img);
  cv::Point_<int>::Point_(&local_c0,0,0);
  cv::Scalar_<double>::Scalar_(&local_e0,255.0,0.0,255.0,0.0);
  cv::circle(&local_b8,&local_c0,0x12f,&local_e0,1,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"WSN",&local_101);
  cv::_InputArray::_InputArray(&local_120,&this->img);
  cv::imshow(local_100,&local_120);
  cv::_InputArray::~_InputArray(&local_120);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  if ((this->Test & 1U) == 1) {
    cv::waitKey(200);
  }
  cv::_InputOutputArray::_InputOutputArray(&local_138,&this->img);
  cv::Point_<int>::Point_(&local_140,0,0);
  cv::Scalar_<double>::Scalar_(&local_160,255.0,0.0,255.0,0.0);
  cv::circle(&local_138,&local_140,0x1ac,&local_160,1,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_180,"WSN",&local_181);
  cv::_InputArray::_InputArray(&local_1a0,&this->img);
  cv::imshow(local_180,&local_1a0);
  cv::_InputArray::~_InputArray(&local_1a0);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  if ((this->Test & 1U) == 1) {
    cv::waitKey(200);
  }
  cv::_InputOutputArray::_InputOutputArray(&local_1b8,&this->img);
  cv::Point_<int>::Point_(&local_1c0,0,0);
  cv::Scalar_<double>::Scalar_(&local_1e0,255.0,0.0,255.0,0.0);
  cv::circle(&local_1b8,&local_1c0,0x20c,&local_1e0,1,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_200,"WSN",&local_201);
  cv::_InputArray::_InputArray(&local_220,&this->img);
  cv::imshow(local_200,&local_220);
  cv::_InputArray::~_InputArray(&local_220);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  if ((this->Test & 1U) == 1) {
    cv::waitKey(200);
  }
  cv::_InputOutputArray::_InputOutputArray(&local_238,&this->img);
  cv::Point_<int>::Point_(&local_240,0,0);
  cv::Scalar_<double>::Scalar_(&local_260,255.0,0.0,255.0,0.0);
  cv::circle(&local_238,&local_240,0x260,&local_260,1,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_238);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_280,"WSN",&local_281);
  cv::_InputArray::_InputArray(&local_2a0,&this->img);
  cv::imshow(local_280,&local_2a0);
  cv::_InputArray::~_InputArray(&local_2a0);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator(&local_281);
  if ((this->Test & 1U) == 1) {
    cv::waitKey(0);
  }
  return;
}

Assistant:

void WSNTopologyBasedEnergy::DrawWSNLayer()
{
	circle(img,Point(0,0),1,Scalar(255,0,255));
	imshow("WSN",img);
	if(true==Test) waitKey(200);

	circle(img,Point(0,0),303,Scalar(255,0,255));
	imshow("WSN",img);
	if(true==Test) waitKey(200);

	circle(img,Point(0,0),428,Scalar(255,0,255));
	imshow("WSN",img);
	if(true==Test) waitKey(200);

	circle(img,Point(0,0),524,Scalar(255,0,255));
	imshow("WSN",img);
	if(true==Test) waitKey(200);

	circle(img,Point(0,0),608,Scalar(255,0,255));
	imshow("WSN",img);
	if(true==Test) waitKey();
}